

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_>::PrintTopologicalInfo
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_> *this,ostream *out)

{
  int iVar1;
  ostream *poVar2;
  TPZGeoNode *pTVar3;
  int i;
  string asStack_48 [32];
  
  poVar2 = std::operator<<(out,"Geo Element - fId ");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  poVar2 = std::operator<<(poVar2,"\t Type ");
  pzgeom::TPZGeoLinear::TypeName_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,asStack_48);
  std::operator<<(poVar2,"\t");
  std::__cxx11::string::~string(asStack_48);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::Print(&this->fGeo,out);
  poVar2 = std::endl<char,std::char_traits<char>>(out);
  std::operator<<(poVar2,"\t");
  i = 0;
  while( true ) {
    iVar1 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x90))(this);
    if (iVar1 <= i) break;
    pTVar3 = TPZGeoEl::NodePtr(&this->super_TPZGeoEl,i);
    poVar2 = (ostream *)std::ostream::operator<<(out,pTVar3->fId);
    std::operator<<(poVar2," ");
    i = i + 1;
  }
  return;
}

Assistant:

virtual void PrintTopologicalInfo(std::ostream &out) override
	{
		out << "Geo Element - fId " << fId << "\t Type " << fGeo.TypeName() << "\t";
		fGeo.Print(out);
		int i;
		out << std::endl << "\t";
		for (i = 0;i < NNodes();i++) out << NodePtr(i)->Id() << " ";
	}